

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void non_existent_scandir_cb(uv_fs_t *req)

{
  int iVar1;
  undefined1 local_20 [8];
  uv_dirent_t dent;
  uv_fs_t *req_local;
  
  dent._8_8_ = req;
  if (req != &scandir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x285,"req == &scandir_req");
    abort();
  }
  if (scandir_req.fs_type != UV_FS_SCANDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x286,"req->fs_type == UV_FS_SCANDIR");
    abort();
  }
  if (scandir_req.result != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x287,"req->result == UV_ENOENT");
    abort();
  }
  if (scandir_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x288,"req->ptr == NULL");
    abort();
  }
  iVar1 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)local_20);
  if (iVar1 != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x289,"UV_ENOENT == uv_fs_scandir_next(req, &dent)");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)dent._8_8_);
  scandir_cb_count = scandir_cb_count + 1;
  return;
}

Assistant:

static void non_existent_scandir_cb(uv_fs_t* req) {
  uv_dirent_t dent;

  ASSERT(req == &scandir_req);
  ASSERT(req->fs_type == UV_FS_SCANDIR);
  ASSERT(req->result == UV_ENOENT);
  ASSERT(req->ptr == NULL);
  ASSERT(UV_ENOENT == uv_fs_scandir_next(req, &dent));
  uv_fs_req_cleanup(req);
  scandir_cb_count++;
}